

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O1

bool Js::JavascriptLibrary::InitializeSetConstructor
               (DynamicObject *setConstructor,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  ScriptContext *this_00;
  RuntimeFunction *pRVar1;
  RuntimeFunction *pRVar2;
  PropertyString *pPVar3;
  
  DeferredTypeHandlerBase::Convert(typeHandler,setConstructor,mode,3,0);
  this = (((setConstructor->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  this_00 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  (*(setConstructor->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(setConstructor,0xd1,0x1000000000000,2,0,0,0);
  (*(setConstructor->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])
            (setConstructor,0x124,(this->super_JavascriptLibraryBase).setPrototype.ptr,0,0,0,0);
  pRVar2 = CreateGetterFunction
                     (this,0x2c6,(FunctionInfo *)JavascriptSet::EntryInfo::GetterSymbolSpecies);
  pRVar1 = (RuntimeFunction *)(this->super_JavascriptLibraryBase).undefinedValue.ptr;
  if (pRVar2 == (RuntimeFunction *)0x0) {
    pRVar2 = pRVar1;
  }
  (*(setConstructor->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x2d])(setConstructor,0x19,pRVar2,pRVar1,0);
  (*(setConstructor->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x3e])(setConstructor,0x19,6);
  pPVar3 = ScriptContext::GetPropertyString(this_00,0x13d);
  (*(setConstructor->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(setConstructor,0x106,pPVar3,2,0,0,0);
  DynamicObject::SetHasNoEnumerableProperties(setConstructor,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeSetConstructor(DynamicObject* setConstructor, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(setConstructor, mode, 3);
        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterSet
        // so that the update is in sync with profiler
        JavascriptLibrary* library = setConstructor->GetLibrary();
        ScriptContext* scriptContext = setConstructor->GetScriptContext();
        library->AddMember(setConstructor, PropertyIds::length, TaggedInt::ToVarUnchecked(0), PropertyConfigurable);
        library->AddMember(setConstructor, PropertyIds::prototype, library->setPrototype, PropertyNone);
        library->AddSpeciesAccessorsToLibraryObject(setConstructor, &JavascriptSet::EntryInfo::GetterSymbolSpecies);

        library->AddMember(setConstructor, PropertyIds::name, scriptContext->GetPropertyString(PropertyIds::Set), PropertyConfigurable);

        setConstructor->SetHasNoEnumerableProperties(true);

        return true;
    }